

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstreambuf.cpp
# Opt level: O3

int_type __thiscall sai::ifstreambuf::underflow(ifstreambuf *this)

{
  long lVar1;
  byte *pbVar2;
  uint uVar3;
  
  uVar3 = 0xffffffff;
  if (((&this->field_0x60)[*(long *)(*(long *)&this->FileIn + -0x18)] & 2) == 0) {
    pbVar2 = *(byte **)&this->field_0x10;
    if (pbVar2 == *(byte **)&this->field_0x18) {
      lVar1 = (**(code **)(*(long *)this + 0x28))(this,(ulong)(this->CurrentPage + 1) << 0xc,0,8);
      if (lVar1 == -1) {
        return -1;
      }
      pbVar2 = *(byte **)&this->field_0x10;
    }
    uVar3 = (uint)*pbVar2;
  }
  return uVar3;
}

Assistant:

std::streambuf::int_type ifstreambuf::underflow()
{
	if( FileIn.eof() )
	{
		return traits_type::eof();
	}

	if( gptr() == egptr() )
	{
		// buffer depleated, get next block
		if( seekpos((CurrentPage + 1) * VirtualPage::PageSize)
			== std::streampos(std::streamoff(-1)) )
		{
			// Seek position error
			return traits_type::eof();
		}
	}

	return traits_type::to_int_type(*gptr());
}